

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O3

RC __thiscall QL_NodeRel::OpenIt(QL_NodeRel *this,void *data)

{
  int extraout_EAX;
  int iVar1;
  RC RVar2;
  
  (this->super_QL_Node).isOpen = true;
  this->value = data;
  IX_Manager::DestroyIndex(((this->super_QL_Node).qlm)->ixm);
  iVar1 = extraout_EAX;
  if (extraout_EAX == 0) {
    iVar1 = yyparse();
    if (iVar1 == 0) {
      RVar2 = RM_Manager::OpenFile(((this->super_QL_Node).qlm)->rmm,this->relName,&this->fh);
      return RVar2;
    }
  }
  return iVar1;
}

Assistant:

RC QL_NodeRel::OpenIt(void *data){
  RC rc = 0;
  isOpen = true;
  value = data;
  if((rc = qlm.ixm.OpenIndex(relName, indexNo, ih)))
    return (rc);
  if((rc = is.OpenScan(ih, EQ_OP, value)))
    return (rc);
  if((rc = qlm.rmm.OpenFile(relName, fh)))
    return (rc);
  return (0);
}